

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  long v1;
  byte bVar1;
  uint32_t uVar2;
  DescriptorPool *this_00;
  bool bVar3;
  ExtensionRange *pEVar4;
  FieldDescriptor *field;
  Nonnull<const_char_*> pcVar5;
  uint res;
  byte *pbVar6;
  int iVar7;
  uint number;
  long v1_00;
  int iVar8;
  char cVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  byte *local_48 [3];
  
  local_48[0] = (byte *)ptr;
  do {
    bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_48[0];
    }
    bVar1 = *local_48[0];
    res = (uint)bVar1;
    pbVar6 = local_48[0] + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
      if ((char)*pbVar6 < '\0') {
        pVar10 = ReadTagFallback((char *)local_48[0],res);
        pbVar6 = (byte *)pVar10.first;
        res = pVar10.second;
      }
      else {
        pbVar6 = local_48[0] + 2;
      }
    }
    local_48[0] = pbVar6;
    if (pbVar6 == (byte *)0x0) {
      cVar9 = '\x01';
    }
    else if (res == 0 || (res & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar9 = '\x03';
    }
    else {
      if (res == 0xb) {
        iVar7 = ctx->depth_;
        v1 = (long)iVar7 + -1;
        iVar8 = (int)v1;
        ctx->depth_ = iVar8;
        if ((long)iVar7 < 1) {
          pbVar6 = (byte *)0x0;
        }
        else {
          v1_00 = (long)ctx->group_depth_ + 1;
          iVar7 = (int)v1_00;
          ctx->group_depth_ = iVar7;
          pbVar6 = (byte *)ParseElement(this,(char *)pbVar6,ctx);
          if (pbVar6 != (byte *)0x0) {
            if (iVar8 == ctx->depth_) {
              pcVar5 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)ctx->depth_,"old_depth == depth_");
            }
            if (pcVar5 != (Nonnull<const_char_*>)0x0) {
              ParseMessageSet();
LAB_010265b9:
              ParseMessageSet();
            }
            if (iVar7 == ctx->group_depth_) {
              pcVar5 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1_00,(long)ctx->group_depth_,"old_group_depth == group_depth_");
            }
            if (pcVar5 != (Nonnull<const_char_*>)0x0) goto LAB_010265b9;
          }
          ctx->group_depth_ = ctx->group_depth_ + -1;
          ctx->depth_ = ctx->depth_ + 1;
          uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          if (uVar2 != 0xb) {
            pbVar6 = (byte *)0x0;
          }
        }
      }
      else {
        number = res >> 3;
        pEVar4 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor,number);
        if (pEVar4 == (ExtensionRange *)0x0) {
          field = (FieldDescriptor *)0x0;
        }
        else {
          this_00 = (ctx->data_).pool;
          if (this_00 == (DescriptorPool *)0x0) {
            field = Reflection::FindKnownExtensionByNumber(this->reflection,number);
          }
          else {
            field = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor,number);
          }
        }
        pbVar6 = (byte *)_InternalParseAndMergeField
                                   (this->msg,(char *)local_48[0],ctx,(ulong)res,this->reflection,
                                    field);
      }
      cVar9 = pbVar6 == (byte *)0x0;
      local_48[0] = pbVar6;
    }
    if (cVar9 != '\0') {
      if (cVar9 == '\x01') {
        local_48[0] = (byte *)0x0;
      }
      return (char *)local_48[0];
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }